

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall dgrminer::PartialUnion::outputEncodingToFile(PartialUnion *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  _Self local_238;
  _Self local_230;
  iterator it;
  string local_218 [8];
  ofstream myfile;
  string *filename_local;
  PartialUnion *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)filename);
  poVar2 = std::operator<<((ostream *)local_218,"label,label_int,is_change,label_int_prev");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_230._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin(&this->labelEncoding);
  while( true ) {
    local_238._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->labelEncoding);
    bVar1 = std::operator!=(&local_230,&local_238);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)local_218,"\"");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_230);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2,"\",");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_230);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    poVar2 = std::operator<<(poVar2,",");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_230);
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->labelIsChange,&ppVar3->second);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(*pmVar4 & 1));
    poVar2 = std::operator<<(poVar2,",");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_230);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->antecedentLabelsOfLabels,&ppVar3->second);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pmVar5);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_230);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void PartialUnion::outputEncodingToFile(string filename)
	{
		ofstream myfile;

		myfile.open(filename);

		myfile << "label,label_int,is_change,label_int_prev" << endl;
		for (std::map<std::string, int>::iterator it = labelEncoding.begin(); it != labelEncoding.end(); ++it)
		{
			myfile << "\"" << it->first << "\"," << it->second << "," << labelIsChange[it->second] << "," << antecedentLabelsOfLabels[it->second] << endl;
		}

		myfile.close();
	}